

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection.c
# Opt level: O0

ENDPOINT_INSTANCE *
find_session_endpoint_by_outgoing_channel(CONNECTION_HANDLE connection,uint16_t outgoing_channel)

{
  LOGGER_LOG p_Var1;
  LOGGER_LOG l;
  ENDPOINT_INSTANCE *result;
  uint32_t i;
  uint16_t outgoing_channel_local;
  CONNECTION_HANDLE connection_local;
  
  result._0_4_ = 0;
  while (((uint)result < connection->endpoint_count &&
         (connection->endpoints[(uint)result]->outgoing_channel != outgoing_channel))) {
    result._0_4_ = (uint)result + 1;
  }
  if ((uint)result == connection->endpoint_count) {
    p_Var1 = xlogging_get_log_function();
    if (p_Var1 != (LOGGER_LOG)0x0) {
      (*p_Var1)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/connection.c"
                ,"find_session_endpoint_by_outgoing_channel",0x251,1,
                "Cannot find session endpoint for channel %u",(uint)outgoing_channel);
    }
    l = (LOGGER_LOG)0x0;
  }
  else {
    l = (LOGGER_LOG)connection->endpoints[(uint)result];
  }
  return (ENDPOINT_INSTANCE *)l;
}

Assistant:

static ENDPOINT_INSTANCE* find_session_endpoint_by_outgoing_channel(CONNECTION_HANDLE connection, uint16_t outgoing_channel)
{
    uint32_t i;
    ENDPOINT_INSTANCE* result;

    for (i = 0; i < connection->endpoint_count; i++)
    {
        if (connection->endpoints[i]->outgoing_channel == outgoing_channel)
        {
            break;
        }
    }

    if (i == connection->endpoint_count)
    {
        LogError("Cannot find session endpoint for channel %u", (unsigned int)outgoing_channel);
        result = NULL;
    }
    else
    {
        result = connection->endpoints[i];
    }

    return result;
}